

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_suite.cpp
# Opt level: O0

void parser_suite::parse_record_nested_record(void)

{
  bool v;
  char *pcVar1;
  uchar (*in_RDX) [13];
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_00;
  basic_variable<std::allocator<char>_> *local_220;
  basic_variable<std::allocator<char>_> *local_208;
  const_iterator local_1e8;
  const_iterator local_1d0;
  iterator local_1b8;
  iterator local_1a0;
  undefined1 local_185;
  nullable local_184;
  basic_variable<std::allocator<char>_> *local_180;
  basic_variable<std::allocator<char>_> local_178;
  undefined1 auStack_148 [80];
  basic_variable<std::allocator<char>_> local_f8;
  basic_variable<std::allocator<char>_> local_c8;
  undefined1 local_98 [24];
  basic_variable<std::allocator<char>_> expected;
  undefined1 local_48 [8];
  basic_variable<std::allocator<char>_> result;
  value_type input [13];
  
  result.storage._40_5_ = 0x424103a990;
  result.storage._45_3_ = 0xb29043;
  trial::protocol::bintoken::parse<unsigned_char[13],std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)local_48,
             (bintoken *)&result.storage.field_0x28,in_RDX);
  v = trial::dynamic::basic_variable<std::allocator<char>>::
      is<trial::dynamic::basic_array<std::allocator<char>>>
                ((basic_variable<std::allocator<char>> *)local_48);
  pcVar1 = "void parser_suite::parse_record_nested_record()";
  boost::detail::test_impl
            ("result.is<array>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x1a6,"void parser_suite::parse_record_nested_record()",v);
  local_185 = 1;
  auStack_148._24_8_ = auStack_148 + 0x20;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)auStack_148._24_8_,"ABC");
  local_180 = &local_178;
  auStack_148._24_8_ = &local_f8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_180,0x7f);
  auStack_148._8_8_ = &local_178;
  auStack_148._16_8_ = 1;
  init._M_len = (size_type)pcVar1;
  init._M_array = (iterator)0x1;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            (&local_f8,(basic_array<std::allocator<char>_> *)auStack_148._8_8_,init);
  auStack_148._24_8_ = &local_c8;
  local_184 = null;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)auStack_148._24_8_,&local_184);
  local_185 = 0;
  local_98._0_8_ = auStack_148 + 0x20;
  local_98._8_8_ = 3;
  init_00._M_len = (size_type)pcVar1;
  init_00._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_98 + 0x10),
             (basic_array<std::allocator<char>_> *)local_98._0_8_,init_00);
  local_208 = (basic_variable<std::allocator<char>_> *)local_98;
  do {
    local_208 = local_208 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_208);
  } while (local_208 != (basic_variable<std::allocator<char>_> *)(auStack_148 + 0x20));
  local_220 = (basic_variable<std::allocator<char>_> *)auStack_148;
  do {
    local_220 = local_220 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_220);
  } while (local_220 != &local_178);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1a0,(basic_variable<std::allocator<char>_> *)local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1b8,(basic_variable<std::allocator<char>_> *)local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1d0,(basic_variable<std::allocator<char>_> *)(local_98 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1e8,(basic_variable<std::allocator<char>_> *)(local_98 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::const_iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>const>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x1aa,"void parser_suite::parse_record_nested_record()",&local_1a0,&local_1b8,
             &local_1d0,&local_1e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator(&local_1e8)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator(&local_1d0)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1a0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_98 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_48);
  return;
}

Assistant:

void parse_record_nested_record()
{
    const value_type input[] = {
        bintoken::token::code::begin_record,
        bintoken::token::code::string8, 0x03, 0x41, 0x42, 0x43,
        bintoken::token::code::begin_record,
        bintoken::token::code::int16, 0x7F, 0x00,
        bintoken::token::code::end_record,
        bintoken::token::code::null,
        bintoken::token::code::end_record
    };
    auto result = bintoken::parse(input);
    TRIAL_PROTOCOL_TEST(result.is<array>());
    const auto expected = array::make({ "ABC", array::make({ 127 }), null });
    TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                 expected.begin(), expected.end(),
                                 std::equal_to<decltype(expected)>());
}